

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_TestGetTruthTablePars(char *pFileName,word *pTruth,int *nVars,int *nLutSize,int *nNodes)

{
  int iVar1;
  size_t sVar2;
  byte *__dest;
  byte bVar3;
  char *__s;
  byte *__nptr;
  bool bVar4;
  
  sVar2 = strlen(pFileName);
  __dest = (byte *)malloc(sVar2 + 1);
  strcpy((char *)__dest,pFileName);
  bVar3 = *__dest;
  __nptr = __dest;
  if (bVar3 == 0) {
    bVar3 = 0;
  }
  else {
    do {
      if (((byte)(bVar3 - 0x3a) < 0xf6) && ((byte)((bVar3 & 0xdf) + 0xb9) < 0xfa))
      goto LAB_005b212c;
      bVar3 = __nptr[1];
      __nptr = __nptr + 1;
    } while (bVar3 != 0);
    bVar3 = 0;
  }
LAB_005b212c:
  *__nptr = 0;
  sVar2 = strlen((char *)__dest);
  iVar1 = (int)sVar2;
  if (iVar1 < 0x10) {
    switch(iVar1) {
    case 1:
      iVar1 = 2;
      break;
    case 2:
      iVar1 = 3;
      break;
    default:
switchD_005b2157_caseD_3:
      free(__dest);
      __s = "Invalid truth table size.";
      goto LAB_005b2217;
    case 4:
      iVar1 = 4;
      break;
    case 8:
      iVar1 = 5;
    }
  }
  else if (iVar1 == 0x10) {
    iVar1 = 6;
  }
  else if (iVar1 == 0x20) {
    iVar1 = 7;
  }
  else {
    if (iVar1 != 0x40) goto switchD_005b2157_caseD_3;
    iVar1 = 8;
  }
  *nVars = iVar1;
  Abc_TtReadHex(pTruth,(char *)__dest);
  *__nptr = bVar3;
  do {
    if (bVar3 == 0) goto LAB_005b2208;
    __nptr = __nptr + 1;
    bVar4 = bVar3 != 0x2d;
    bVar3 = *__nptr;
  } while (bVar4);
  if (bVar3 == 0) {
LAB_005b2208:
    free(__dest);
    __s = "Expecting \'-\' after truth table before LUT size.";
  }
  else {
    iVar1 = atoi((char *)__nptr);
    *nLutSize = iVar1;
    do {
      bVar3 = *__nptr;
      if (bVar3 == 0) goto LAB_005b222d;
      __nptr = __nptr + 1;
    } while (bVar3 != 0x2d);
    if (*__nptr != 0) {
      iVar1 = atoi((char *)__nptr);
      *nNodes = iVar1;
      free(__dest);
      return 1;
    }
LAB_005b222d:
    free(__dest);
    __s = "Expecting \'-\' after LUT size before node count.";
  }
LAB_005b2217:
  puts(__s);
  return 0;
}

Assistant:

int Zyx_TestGetTruthTablePars( char * pFileName, word * pTruth, int * nVars, int * nLutSize, int * nNodes )
{
    char Symb, * pCur, * pBuffer = Abc_UtilStrsav( pFileName );
    int nLength;
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !Abc_TtIsHexDigit(*pCur) )
            break;
    Symb = *pCur; *pCur = 0;
    nLength = (int)strlen(pBuffer);
    if ( nLength == 1 )
        *nVars = 2;
    else if ( nLength == 2 )
        *nVars = 3;
    else if ( nLength == 4 )
        *nVars = 4;
    else if ( nLength == 8 )
        *nVars = 5;
    else if ( nLength == 16 )
        *nVars = 6;
    else if ( nLength == 32 )
        *nVars = 7;
    else if ( nLength == 64 )
        *nVars = 8;
    else
    {
        ABC_FREE( pBuffer );
        printf( "Invalid truth table size.\n" );
        return 0;
    }
    Abc_TtReadHex( pTruth, pBuffer );
    *pCur = Symb;
    // read LUT size
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after truth table before LUT size.\n" );
        return 0;
    }
    // read node count
    *nLutSize = atoi(pCur);
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after LUT size before node count.\n" );
        return 0;
    }
    *nNodes = atoi(pCur);
    ABC_FREE( pBuffer );
    return 1;
}